

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall
duckdb::QueryProfiler::StartQuery
          (QueryProfiler *this,string *query,bool is_explain_analyze_p,bool start_at_optimizer)

{
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> _Var1;
  pointer pMVar2;
  int iVar3;
  rep rVar4;
  char cVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  if (is_explain_analyze_p) {
    this->is_explain_analyze = true;
  }
  if ((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true)) {
    if (start_at_optimizer) {
      cVar5 = (this->context->config).profiler_print_format == QUERY_TREE_OPTIMIZER;
      if (this->is_explain_analyze == false && !(bool)cVar5) {
        cVar5 = (this->context->config).enable_detailed_profiling;
      }
      if (cVar5 == '\0') goto LAB_004c86ca;
    }
    if (this->running == false) {
      this->running = true;
      ::std::__cxx11::string::operator=((string *)&this->query_info,(string *)query);
      ::std::
      _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(this->tree_map)._M_h);
      _Var1._M_head_impl =
           (this->root).
           super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
           .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
      (this->root).
      super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>.
      super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl = (ProfilingNode *)0x0;
      if (_Var1._M_head_impl != (ProfilingNode *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_ProfilingNode + 8))();
      }
      ::std::
      _Hashtable<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_double>,_std::allocator<std::pair<const_duckdb::MetricsType,_double>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(this->phase_timings)._M_h);
      pMVar2 = (this->phase_stack).
               super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
               super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((this->phase_stack).
          super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
          super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
          super__Vector_impl_data._M_finish != pMVar2) {
        (this->phase_stack).super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
        super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
        super__Vector_impl_data._M_finish = pMVar2;
      }
      (this->main_query).finished = false;
      rVar4 = ::std::chrono::_V2::steady_clock::now();
      (this->main_query).start.__d.__r = rVar4;
    }
  }
LAB_004c86ca:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void QueryProfiler::StartQuery(string query, bool is_explain_analyze_p, bool start_at_optimizer) {
	lock_guard<std::mutex> guard(lock);
	if (is_explain_analyze_p) {
		StartExplainAnalyze();
	}
	if (!IsEnabled()) {
		return;
	}
	if (start_at_optimizer && !PrintOptimizerOutput()) {
		// This is the StartQuery call before the optimizer, but we don't have to print optimizer output
		return;
	}
	if (running) {
		// Called while already running: this should only happen when we print optimizer output
		D_ASSERT(PrintOptimizerOutput());
		return;
	}

	running = true;
	query_info.query_name = std::move(query);
	tree_map.clear();
	root = nullptr;
	phase_timings.clear();
	phase_stack.clear();
	main_query.Start();
}